

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlIsRef(xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr)

{
  xmlChar *local_40;
  xmlChar *aprefix;
  xmlAttributePtr attrDecl;
  xmlAttrPtr attr_local;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  
  if (attr == (xmlAttrPtr)0x0) {
    doc_local._4_4_ = 0;
  }
  else {
    elem_local = (xmlNodePtr)doc;
    if ((doc == (xmlDocPtr)0x0) &&
       (elem_local = (xmlNodePtr)attr->doc, (_xmlDoc *)elem_local == (_xmlDoc *)0x0)) {
      doc_local._4_4_ = 0;
    }
    else if ((elem_local->content == (xmlChar *)0x0) && (elem_local->properties == (_xmlAttr *)0x0))
    {
      doc_local._4_4_ = 0;
    }
    else if (elem_local->type == XML_HTML_DOCUMENT_NODE) {
      doc_local._4_4_ = 0;
    }
    else if (elem == (xmlNodePtr)0x0) {
      doc_local._4_4_ = 0;
    }
    else {
      if (attr->ns == (xmlNs *)0x0) {
        local_40 = (xmlChar *)0x0;
      }
      else {
        local_40 = attr->ns->prefix;
      }
      aprefix = (xmlChar *)
                xmlGetDtdQAttrDesc((xmlDtdPtr)elem_local->content,elem->name,attr->name,local_40);
      if (((xmlAttributePtr)aprefix == (xmlAttributePtr)0x0) &&
         (elem_local->properties != (_xmlAttr *)0x0)) {
        aprefix = (xmlChar *)
                  xmlGetDtdQAttrDesc((xmlDtdPtr)elem_local->properties,elem->name,attr->name,
                                     local_40);
      }
      if ((aprefix == (xmlChar *)0x0) ||
         ((*(int *)(aprefix + 0x50) != 3 && (*(int *)(aprefix + 0x50) != 4)))) {
        doc_local._4_4_ = 0;
      }
      else {
        doc_local._4_4_ = 1;
      }
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlIsRef(xmlDocPtr doc, xmlNodePtr elem, xmlAttrPtr attr) {
    if (attr == NULL)
        return(0);
    if (doc == NULL) {
        doc = attr->doc;
	if (doc == NULL) return(0);
    }

    if ((doc->intSubset == NULL) && (doc->extSubset == NULL)) {
        return(0);
    } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
        /* TODO @@@ */
        return(0);
    } else {
        xmlAttributePtr attrDecl;
        const xmlChar *aprefix;

        if (elem == NULL) return(0);
        aprefix = (attr->ns != NULL) ? attr->ns->prefix : NULL;
        attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elem->name, attr->name,
                                      aprefix);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elem->name, attr->name,
                                          aprefix);

	if ((attrDecl != NULL) &&
	    (attrDecl->atype == XML_ATTRIBUTE_IDREF ||
	     attrDecl->atype == XML_ATTRIBUTE_IDREFS))
	return(1);
    }
    return(0);
}